

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  roaring_pq_t *prVar1;
  int in_EDI;
  roaring_bitmap_t *answer;
  roaring_pq_element_t X;
  roaring_pq_element_t newelement_1;
  uint64_t bsize_1;
  roaring_bitmap_t *newb_1;
  roaring_pq_element_t newelement;
  uint64_t bsize;
  _Bool temporary;
  roaring_bitmap_t *newb;
  roaring_pq_element_t x2;
  roaring_pq_element_t x1;
  roaring_pq_t *pq;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined8 in_stack_ffffffffffffff38;
  roaring_bitmap_t **in_stack_ffffffffffffff40;
  roaring_pq_element_t *in_stack_ffffffffffffff48;
  roaring_pq_t *in_stack_ffffffffffffff50;
  roaring_bitmap_t *in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  roaring_bitmap_t *in_stack_ffffffffffffff90;
  _Bool bitsetconversion;
  roaring_bitmap_t *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  byte local_48;
  roaring_bitmap_t *local_40;
  size_t in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  roaring_bitmap_t *in_stack_ffffffffffffffd8;
  roaring_pq_t *local_8;
  
  if (in_EDI == 0) {
    local_8 = (roaring_pq_t *)roaring_bitmap_create();
  }
  else if (in_EDI == 1) {
    local_8 = (roaring_pq_t *)roaring_bitmap_copy((roaring_bitmap_t *)in_stack_ffffffffffffff48);
  }
  else {
    prVar1 = create_pq(in_stack_ffffffffffffff40,
                       (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    while (1 < prVar1->size) {
      pq_poll((roaring_pq_t *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      pq_poll((roaring_pq_t *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      if (((in_stack_ffffffffffffffd0 & 1) == 0) || ((local_48 & 1) == 0)) {
        bitsetconversion = SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0);
        if ((local_48 & 1) == 0) {
          if ((in_stack_ffffffffffffffd0 & 1) == 0) {
            roaring_bitmap_lazy_or
                      (in_stack_ffffffffffffffd8,
                       (roaring_bitmap_t *)
                       CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                       SUB81(in_stack_ffffffffffffffc8 >> 0x38,0));
            roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x112bf3);
            pq_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          else {
            roaring_bitmap_lazy_or_inplace
                      ((roaring_bitmap_t *)
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98,bitsetconversion);
            in_stack_ffffffffffffffc8 =
                 roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x112bae);
            pq_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
        }
        else {
          roaring_bitmap_lazy_or_inplace
                    ((roaring_bitmap_t *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98,bitsetconversion);
          roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x112b5e);
          pq_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
      }
      else {
        in_stack_ffffffffffffff90 =
             lazy_or_from_lazy_inputs
                       ((roaring_bitmap_t *)
                        CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
                        in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff37 =
             in_stack_ffffffffffffff90 == in_stack_ffffffffffffffd8 &&
             in_stack_ffffffffffffff90 == local_40;
        in_stack_ffffffffffffffa7 = (in_stack_ffffffffffffff37 ^ 0xff) & 1;
        in_stack_ffffffffffffff80 =
             (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x112af3)
        ;
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffffa7 & 1;
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff80;
        pq_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
    pq_poll((roaring_pq_t *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)in_stack_ffffffffffffff50);
    pq_free((roaring_pq_t *)0x112c5f);
    local_8 = in_stack_ffffffffffffff50;
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}